

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void console_message_string(char *mes,char *str)

{
  fprintf(_stderr,mes,str);
  return;
}

Assistant:

void console_message_string(const char *mes, char *str)
{
#if defined(_WIN32)
	char *temp1 = u8tosjis(mes);
	if (temp1 == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	char *temp2 = u8tosjis(str);
	if (temp2 == NULL)
	{
		free(temp1);
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	fprintf(stderr, temp1, temp2);
	free(temp2);
	free(temp1);
#else
	fprintf(stderr, mes, str);
#endif
}